

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplerParameterIError.cpp
# Opt level: O0

void __thiscall
glcts::TextureBorderClampSamplerParameterIErrorTest::VerifyGLGetSamplerParameterIuiv
          (TextureBorderClampSamplerParameterIErrorTest *this,GLuint sampler_id,GLenum pname,
          GLenum expected_error)

{
  code *pcVar1;
  int iVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference pvVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_210;
  GetNameFunc local_200;
  int local_1f8;
  Enum<int,_2UL> local_1f0;
  char *local_1e0;
  MessageBuilder local_1d8;
  allocator<unsigned_int> local_41;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> params;
  Functions *gl;
  GLenum error_code;
  GLenum expected_error_local;
  GLenum pname_local;
  GLuint sampler_id_local;
  TextureBorderClampSamplerParameterIErrorTest *this_local;
  
  expected_error_local = sampler_id;
  _pname_local = this;
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_TextureBorderClampBase).super_TestCaseBase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  params.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar2);
  std::allocator<unsigned_int>::allocator(&local_41);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,0x20,&local_41);
  std::allocator<unsigned_int>::~allocator(&local_41);
  GVar3 = expected_error_local;
  pcVar1 = *(code **)(params.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage + 0x290);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,0);
  (*pcVar1)(GVar3,pname,pvVar5);
  GVar3 = (**(code **)(params.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
  if (expected_error != GVar3) {
    this->m_test_passed = '\0';
    this_00 = tcu::TestContext::getLog
                        ((this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1d8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1d8,(char (*) [40])"glGetSamplerParameterIuivEXT() failed:[");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])"sampler id:");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&expected_error_local);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])", pname:");
    local_1e0 = TextureBorderClampBase::getPNameString(&this->super_TextureBorderClampBase,pname);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1e0);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [24])"] reported error code:[");
    EVar7 = glu::getErrorStr(GVar3);
    local_200 = EVar7.m_getName;
    local_1f8 = EVar7.m_value;
    local_1f0.m_getName = local_200;
    local_1f0.m_value = local_1f8;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [24])"] expected error code:[");
    EVar7 = glu::getErrorStr(expected_error);
    local_210.m_getName = EVar7.m_getName;
    local_210.m_value = EVar7.m_value;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_210);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2b3d307);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d8);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  return;
}

Assistant:

void TextureBorderClampSamplerParameterIErrorTest::VerifyGLGetSamplerParameterIuiv(glw::GLuint sampler_id,
																				   glw::GLenum pname,
																				   glw::GLenum expected_error)
{
	glw::GLenum				 error_code = GL_NO_ERROR;
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	std::vector<glw::GLuint> params(m_buffer_size);

	gl.getSamplerParameterIuiv(sampler_id, pname, &params[0]);

	error_code = gl.getError();
	if (expected_error != error_code)
	{
		m_test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "glGetSamplerParameterIuivEXT() failed:["
						   << "sampler id:" << sampler_id << ", pname:" << getPNameString(pname)
						   << "] reported error code:[" << glu::getErrorStr(error_code) << "] expected error code:["
						   << glu::getErrorStr(expected_error) << "]\n"
						   << tcu::TestLog::EndMessage;
	}
}